

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void fio_pubsub_attach(fio_pubsub_engine_s *engine)

{
  uintptr_t uVar1;
  fio_engine_set__ordered_s_ *pfVar2;
  fio_lock_i fVar3;
  fio_engine_set__map_s_ *pfVar4;
  fio_pubsub_engine_s *obj;
  fio_pubsub_engine_s *extraout_RDX;
  fio_engine_set_s *pfVar5;
  fio_engine_set_s *set;
  fio_lock_i ret;
  uintptr_t local_28;
  uintptr_t uStack_20;
  
  LOCK();
  UNLOCK();
  local_28 = CONCAT71(local_28._1_7_,fio_postoffice.engines.lock);
  pfVar5 = (fio_engine_set_s *)engine;
  if (fio_postoffice.engines.lock != '\0') {
    do {
      fio_postoffice.engines.lock = '\x01';
      local_28 = 0;
      uStack_20 = 1;
      pfVar5 = (fio_engine_set_s *)&stack0xffffffffffffffd8;
      nanosleep((timespec *)&stack0xffffffffffffffd8,(timespec *)0x0);
      LOCK();
      UNLOCK();
      local_28 = CONCAT71(local_28._1_7_,fio_postoffice.engines.lock);
    } while (fio_postoffice.engines.lock != '\0');
  }
  fio_postoffice.engines.lock = '\x01';
  set = (fio_engine_set_s *)(-(ulong)(engine == (fio_pubsub_engine_s *)0x0) | (ulong)engine);
  obj = (fio_pubsub_engine_s *)(fio_postoffice.engines.set.pos - fio_postoffice.engines.set.count);
  if (obj <= (fio_pubsub_engine_s *)(fio_postoffice.engines.set.count >> 1)) {
    if (fio_postoffice.engines.set.pos < fio_postoffice.engines.set.capa) goto LAB_0010c134;
    fio_postoffice.engines.set.used_bits = fio_postoffice.engines.set.used_bits + '\x01';
  }
  fio_engine_set_rehash(pfVar5);
  obj = extraout_RDX;
LAB_0010c134:
  pfVar5 = set;
  pfVar4 = fio_engine_set__find_map_pos_(set,(uintptr_t)engine,obj);
  pfVar2 = fio_postoffice.engines.set.ordered;
  uVar1 = fio_postoffice.engines.set.pos;
  if (pfVar4 == (fio_engine_set__map_s_ *)0x0) {
    fio_postoffice.engines.set.ordered[fio_postoffice.engines.set.pos].obj = engine;
    pfVar2[fio_postoffice.engines.set.pos].hash = (uintptr_t)set;
    fio_postoffice.engines.set.pos = fio_postoffice.engines.set.pos + 1;
    fio_postoffice.engines.set.count = fio_postoffice.engines.set.count + 1;
    fio_engine_set_rehash(pfVar5);
  }
  else if (pfVar4->pos == (fio_engine_set__ordered_s_ *)0x0) {
    pfVar4->pos = fio_postoffice.engines.set.ordered + fio_postoffice.engines.set.pos;
    fio_postoffice.engines.set.pos = fio_postoffice.engines.set.pos + 1;
    fio_postoffice.engines.set.count = fio_postoffice.engines.set.count + 1;
    pfVar4->hash = (uintptr_t)set;
    pfVar2[uVar1].hash = (uintptr_t)set;
    pfVar2[uVar1].obj = engine;
  }
  fVar3 = fio_postoffice.engines.lock;
  LOCK();
  fio_postoffice.engines.lock = '\0';
  UNLOCK();
  local_28 = CONCAT71(local_28._1_7_,fVar3);
  fio_pubsub_reattach(engine);
  return;
}

Assistant:

void fio_pubsub_attach(fio_pubsub_engine_s *engine) {
  fio_lock(&fio_postoffice.engines.lock);
  fio_engine_set_insert(&fio_postoffice.engines.set, (uintptr_t)engine, engine);
  fio_unlock(&fio_postoffice.engines.lock);
  fio_pubsub_reattach(engine);
}